

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::NumberFormatterImpl::preProcess
          (NumberFormatterImpl *this,DecimalQuantity *inValue,MicroProps *microsOut,
          UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  MicroProps *microsOut_local;
  DecimalQuantity *inValue_local;
  NumberFormatterImpl *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (this->fMicroPropsGenerator == (MicroPropsGenerator *)0x0) {
      *status = U_INTERNAL_PROGRAM_ERROR;
    }
    else {
      (*this->fMicroPropsGenerator->_vptr_MicroPropsGenerator[2])
                (this->fMicroPropsGenerator,inValue,microsOut,status);
      RoundingImpl::apply(&microsOut->rounder,inValue,status);
      IntegerWidth::apply(&microsOut->integerWidth,inValue,status);
    }
  }
  return;
}

Assistant:

void NumberFormatterImpl::preProcess(DecimalQuantity& inValue, MicroProps& microsOut,
                                     UErrorCode& status) const {
    if (U_FAILURE(status)) { return; }
    if (fMicroPropsGenerator == nullptr) {
        status = U_INTERNAL_PROGRAM_ERROR;
        return;
    }
    fMicroPropsGenerator->processQuantity(inValue, microsOut, status);
    microsOut.rounder.apply(inValue, status);
    microsOut.integerWidth.apply(inValue, status);
}